

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task.cpp
# Opt level: O0

MPP_RET mpp_task_meta_get_ptr(MppTask task,MppMetaKey key,void **val,void *default_val)

{
  MPP_RET MVar1;
  MPP_RET ret;
  MppTaskImpl *impl;
  void *default_val_local;
  void **val_local;
  MppMetaKey key_local;
  MppTask task_local;
  
  MVar1 = check_mpp_task_name(task);
  if (MVar1 == MPP_OK) {
    task_local._4_4_ = mpp_meta_get_ptr(*(MppMeta *)((long)task + 0x28),key,val);
    if (task_local._4_4_ != MPP_OK) {
      *val = default_val;
    }
  }
  else {
    task_local._4_4_ = MPP_NOK;
  }
  return task_local._4_4_;
}

Assistant:

MPP_RET mpp_task_meta_get_ptr(MppTask task, MppMetaKey key, void  **val, void *default_val)
{
    if (check_mpp_task_name(task))
        return MPP_NOK;

    MppTaskImpl *impl = (MppTaskImpl *)task;
    MPP_RET ret = mpp_meta_get_ptr(impl->meta, key, val);
    if (ret)
        *val = default_val;
    return ret;
}